

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster_generic::
load_impl<pybind11::detail::copyable_holder_caster<kratos::Param,std::shared_ptr<kratos::Param>,void>>
          (type_caster_generic *this,handle src,bool convert)

{
  byte bVar1;
  PyTypeObject *type;
  pointer pptVar2;
  pointer pp_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar7;
  type_info *ptVar8;
  internals *this_00;
  iterator iVar9;
  pointer pptVar10;
  pointer pp_Var11;
  key_type local_58;
  object temp;
  
  if (src.m_ptr != (PyObject *)0x0) {
    if (this->typeinfo == (type_info *)0x0) {
      bVar4 = try_load_foreign_module_local(this,src);
      return bVar4;
    }
    copyable_holder_caster<kratos::Param,_std::shared_ptr<kratos::Param>,_void>::check_holder_compat
              ((copyable_holder_caster<kratos::Param,_std::shared_ptr<kratos::Param>,_void> *)this);
    type = (src.m_ptr)->ob_type;
    if (type == this->typeinfo->type) {
LAB_0027b41f:
      ptVar8 = (type_info *)0x0;
LAB_0027b42b:
      instance::get_value_and_holder
                ((value_and_holder *)&stack0xffffffffffffffa8,(instance *)src.m_ptr,ptVar8,true);
      copyable_holder_caster<kratos::Param,_std::shared_ptr<kratos::Param>,_void>::load_value
                ((copyable_holder_caster<kratos::Param,_std::shared_ptr<kratos::Param>,_void> *)this
                 ,(value_and_holder *)&stack0xffffffffffffffa8);
      return true;
    }
    iVar5 = PyType_IsSubtype(type);
    if (iVar5 != 0) {
      pvVar7 = all_type_info(type);
      bVar1 = this->typeinfo->field_0x90;
      pptVar10 = (pvVar7->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pptVar2 = (pvVar7->
                super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((long)pptVar2 - (long)pptVar10 == 8) {
        if (((bVar1 & 1) != 0) || ((*pptVar10)->type == this->typeinfo->type)) goto LAB_0027b41f;
      }
      else if (pptVar10 != pptVar2 && 8 < (ulong)((long)pptVar2 - (long)pptVar10)) {
        do {
          ptVar8 = *pptVar10;
          if ((bVar1 & 1) == 0) {
            uVar6 = (uint)(ptVar8->type == this->typeinfo->type);
          }
          else {
            uVar6 = PyType_IsSubtype();
          }
          if (uVar6 != 0) goto LAB_0027b42b;
          pptVar10 = pptVar10 + 1;
        } while (pptVar10 != pptVar2);
      }
      bVar4 = copyable_holder_caster<kratos::Param,_std::shared_ptr<kratos::Param>,_void>::
              try_implicit_casts<std::shared_ptr<kratos::Param>,_0>
                        ((copyable_holder_caster<kratos::Param,_std::shared_ptr<kratos::Param>,_void>
                          *)this,src,convert);
      if (bVar4) {
        return true;
      }
    }
    ptVar8 = this->typeinfo;
    if (convert) {
      pp_Var11 = (ptVar8->implicit_conversions).
                 super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pp_Var3 = (ptVar8->implicit_conversions).
                super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pp_Var11 != pp_Var3) {
        do {
          local_58._M_target = (type_info *)(**pp_Var11)(src.m_ptr,this->typeinfo->type);
          bVar4 = load_impl<pybind11::detail::copyable_holder_caster<kratos::Param,std::shared_ptr<kratos::Param>,void>>
                            (this,(handle)local_58._M_target,false);
          if (bVar4) {
            loader_life_support::add_patient((handle)local_58._M_target);
            object::~object((object *)&stack0xffffffffffffffa8);
            return true;
          }
          object::~object((object *)&stack0xffffffffffffffa8);
          pp_Var11 = pp_Var11 + 1;
        } while (pp_Var11 != pp_Var3);
        ptVar8 = this->typeinfo;
      }
    }
    if ((ptVar8->field_0x90 & 8) != 0) {
      local_58._M_target = ptVar8->cpptype;
      this_00 = get_internals();
      iVar9 = std::
              _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this_00,&stack0xffffffffffffffa8);
      if ((iVar9.
           super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (*(type_info **)
           ((long)iVar9.
                  super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                  ._M_cur + 0x10) != (type_info *)0x0)) {
        this->typeinfo =
             *(type_info **)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                     ._M_cur + 0x10);
        bVar4 = load_impl<pybind11::detail::type_caster_generic>(this,src,false);
        return bVar4;
      }
    }
    bVar4 = try_load_foreign_module_local(this,src);
    if (bVar4) {
      return true;
    }
    if (convert && src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      this->value = (void *)0x0;
      return true;
    }
  }
  return false;
}

Assistant:

PYBIND11_NOINLINE bool load_impl(handle src, bool convert) {
        if (!src) return false;
        if (!typeinfo) return try_load_foreign_module_local(src);

        auto &this_ = static_cast<ThisT &>(*this);
        this_.check_holder_compat();

        PyTypeObject *srctype = Py_TYPE(src.ptr());

        // Case 1: If src is an exact type match for the target type then we can reinterpret_cast
        // the instance's value pointer to the target type:
        if (srctype == typeinfo->type) {
            this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
            return true;
        }
        // Case 2: We have a derived class
        if (PyType_IsSubtype(srctype, typeinfo->type)) {
            auto &bases = all_type_info(srctype);
            bool no_cpp_mi = typeinfo->simple_type;

            // Case 2a: the python type is a Python-inherited derived class that inherits from just
            // one simple (no MI) pybind11 class, or is an exact match, so the C++ instance is of
            // the right type and we can use reinterpret_cast.
            // (This is essentially the same as case 2b, but because not using multiple inheritance
            // is extremely common, we handle it specially to avoid the loop iterator and type
            // pointer lookup overhead)
            if (bases.size() == 1 && (no_cpp_mi || bases.front()->type == typeinfo->type)) {
                this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
                return true;
            }
            // Case 2b: the python type inherits from multiple C++ bases.  Check the bases to see if
            // we can find an exact match (or, for a simple C++ type, an inherited match); if so, we
            // can safely reinterpret_cast to the relevant pointer.
            if (bases.size() > 1) {
                for (auto base : bases) {
                    if (no_cpp_mi ? PyType_IsSubtype(base->type, typeinfo->type) : base->type == typeinfo->type) {
                        this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder(base));
                        return true;
                    }
                }
            }

            // Case 2c: C++ multiple inheritance is involved and we couldn't find an exact type match
            // in the registered bases, above, so try implicit casting (needed for proper C++ casting
            // when MI is involved).
            if (this_.try_implicit_casts(src, convert))
                return true;
        }

        // Perform an implicit conversion
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                auto temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load_impl<ThisT>(temp, false)) {
                    loader_life_support::add_patient(temp);
                    return true;
                }
            }
            if (this_.try_direct_conversions(src))
                return true;
        }

        // Failed to match local typeinfo. Try again with global.
        if (typeinfo->module_local) {
            if (auto gtype = get_global_type_info(*typeinfo->cpptype)) {
                typeinfo = gtype;
                return load(src, false);
            }
        }

        // Global typeinfo has precedence over foreign module_local
        if (try_load_foreign_module_local(src)) {
           return true;
        }

        // Custom converters didn't take None, now we convert None to nullptr.
        if (src.is_none()) {
           // Defer accepting None to other overloads (if we aren't in convert mode):
           if (!convert) return false;
           value = nullptr;
           return true;
        }

        return false;
    }